

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JFSON.cpp
# Opt level: O0

Json * __thiscall JFSON::JsonObject::operator[](JsonObject *this,string *key)

{
  bool bVar1;
  pointer ppVar2;
  Json *local_38;
  _Self local_28;
  _Self local_20;
  const_iterator iter;
  string *key_local;
  JsonObject *this_local;
  
  iter._M_node = (_Base_ptr)key;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>_>_>
       ::find(&(this->
               super_Value<(JFSON::Json::Type)5,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>_>_>_>
               ).m_value,key);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>_>_>
       ::end(&(this->
              super_Value<(JFSON::Json::Type)5,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>_>_>_>
              ).m_value);
  bVar1 = std::operator==(&local_20,&local_28);
  if (bVar1) {
    local_38 = static_null();
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>_>
             ::operator->(&local_20);
    local_38 = &ppVar2->second;
  }
  return local_38;
}

Assistant:

const Json & JsonObject::operator[] (const string &key) const {
    auto iter = m_value.find(key);
    return (iter == m_value.end()) ? static_null() : iter->second;
}